

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplicationPrivate::shouldSetFocus(QWidget *w,FocusPolicy policy)

{
  bool bVar1;
  FocusPolicy FVar2;
  FocusPolicy in_ESI;
  QWidget *in_RDI;
  QWidget *f;
  bool local_21;
  QWidget *local_20;
  bool local_1;
  
  local_20 = in_RDI;
  while( true ) {
    QWidget::d_func((QWidget *)0x2d4c25);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d4c31);
    local_21 = false;
    if (bVar1) {
      QWidget::d_func((QWidget *)0x2d4c4a);
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d4c56);
      local_21 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d4c62);
    }
    if (local_21 == false) break;
    QWidget::d_func((QWidget *)0x2d4c7a);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x2d4c86);
    local_20 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2d4c92);
  }
  FVar2 = QWidget::focusPolicy(in_RDI);
  if ((FVar2 & in_ESI) == in_ESI) {
    if ((in_RDI == local_20) || (FVar2 = QWidget::focusPolicy(local_20), (FVar2 & in_ESI) == in_ESI)
       ) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QApplicationPrivate::shouldSetFocus(QWidget *w, Qt::FocusPolicy policy)
{
    QWidget *f = w;
    while (f->d_func()->extra && f->d_func()->extra->focus_proxy)
        f = f->d_func()->extra->focus_proxy;

    if ((w->focusPolicy() & policy) != policy)
        return false;
    if (w != f && (f->focusPolicy() & policy) != policy)
        return false;
    return true;
}